

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_time.cpp
# Opt level: O0

double __thiscall BmsTimeManager::GetMinBPM(BmsTimeManager *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self *p_Var3;
  double *pdVar4;
  _Self local_38;
  _Rb_tree_iterator<std::pair<const_int,_BmsTime>_> local_30;
  _Self local_28;
  _Self it;
  double local_18;
  double bpm;
  BmsTimeManager *this_local;
  
  bpm = (double)this;
  it._M_node = (_Base_ptr)
               std::
               map<int,_BmsTime,_std::less<int>,_std::allocator<std::pair<const_int,_BmsTime>_>_>::
               begin(&this->array_);
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_BmsTime>_>::operator->(&it);
  local_18 = (ppVar2->second).bpm;
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_BmsTime,_std::less<int>,_std::allocator<std::pair<const_int,_BmsTime>_>_>::
       begin(&this->array_);
  p_Var3 = std::_Rb_tree_iterator<std::pair<const_int,_BmsTime>_>::operator++(&local_30);
  local_28._M_node = p_Var3->_M_node;
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::map<int,_BmsTime,_std::less<int>,_std::allocator<std::pair<const_int,_BmsTime>_>_>::
         end(&this->array_);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_BmsTime>_>::operator->(&local_28);
    pdVar4 = std::min<double>(&local_18,&(ppVar2->second).bpm);
    local_18 = *pdVar4;
    std::_Rb_tree_iterator<std::pair<const_int,_BmsTime>_>::operator++(&local_28);
  }
  return local_18;
}

Assistant:

double BmsTimeManager::GetMinBPM() {
	double bpm = array_.begin()->second.bpm;
	for (auto it = ++array_.begin(); it != array_.end(); ++it) {
		bpm = std::min(bpm, IT(it).bpm);
	}
	return bpm;
}